

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O0

size_t __thiscall
CDBWrapper::EstimateSizeImpl(CDBWrapper *this,Span<const_std::byte> key1,Span<const_std::byte> key2)

{
  Range *this_00;
  LevelDBContext *pLVar1;
  long in_FS_OFFSET;
  Range range;
  uint64_t size;
  Slice slKey2;
  Slice slKey1;
  CDBWrapper *in_stack_ffffffffffffff38;
  Slice *s;
  undefined1 local_70 [32];
  size_t local_50 [7];
  Slice local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  s = &local_18;
  Span<const_std::byte>::data((Span<const_std::byte> *)in_stack_ffffffffffffff38);
  this_00 = (Range *)CharCast((byte *)in_stack_ffffffffffffff38);
  Span<const_std::byte>::size((Span<const_std::byte> *)in_stack_ffffffffffffff38);
  leveldb::Slice::Slice(&this_00->start,(char *)s,(size_t)in_stack_ffffffffffffff38);
  Span<const_std::byte>::data((Span<const_std::byte> *)in_stack_ffffffffffffff38);
  CharCast((byte *)in_stack_ffffffffffffff38);
  Span<const_std::byte>::size((Span<const_std::byte> *)in_stack_ffffffffffffff38);
  leveldb::Slice::Slice(&this_00->start,(char *)s,(size_t)in_stack_ffffffffffffff38);
  local_50[0] = 0;
  leveldb::Range::Range(this_00,s,(Slice *)in_stack_ffffffffffffff38);
  pLVar1 = DBContext(in_stack_ffffffffffffff38);
  (*pLVar1->pdb->_vptr_DB[10])(pLVar1->pdb,local_70,1,local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_50[0];
  }
  __stack_chk_fail();
}

Assistant:

size_t CDBWrapper::EstimateSizeImpl(Span<const std::byte> key1, Span<const std::byte> key2) const
{
    leveldb::Slice slKey1(CharCast(key1.data()), key1.size());
    leveldb::Slice slKey2(CharCast(key2.data()), key2.size());
    uint64_t size = 0;
    leveldb::Range range(slKey1, slKey2);
    DBContext().pdb->GetApproximateSizes(&range, 1, &size);
    return size;
}